

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlURLInputStream.cpp
# Opt level: O2

size_t __thiscall
xercesc_4_0::CurlURLInputStream::writeCallback
          (CurlURLInputStream *this,char *buffer,size_t size,size_t nitems)

{
  ulong __n;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = size * nitems;
  uVar2 = this->fBytesToRead;
  __n = uVar2;
  if (uVar1 < uVar2) {
    __n = uVar1;
  }
  memcpy(this->fWritePtr,buffer,__n);
  this->fWritePtr = this->fWritePtr + __n;
  this->fBytesRead = this->fBytesRead + __n;
  this->fTotalBytesRead = this->fTotalBytesRead + __n;
  this->fBytesToRead = this->fBytesToRead - __n;
  if (uVar2 <= uVar1 && uVar1 - uVar2 != 0) {
    uVar2 = (long)this + (0x40a1 - (long)this->fBufferHeadPtr);
    if (uVar1 - __n < uVar2) {
      uVar2 = uVar1 - __n;
    }
    memcpy(this->fBufferHeadPtr,buffer + __n,uVar2);
    this->fBufferHeadPtr = this->fBufferHeadPtr + uVar2;
    __n = __n + uVar2;
  }
  return __n;
}

Assistant:

size_t
CurlURLInputStream::writeCallback(char *buffer,
                                  size_t size,
                                  size_t nitems)
{
	XMLSize_t cnt = size * nitems;
	XMLSize_t totalConsumed = 0;

	// Consume as many bytes as possible immediately into the buffer
	XMLSize_t consume = (cnt > fBytesToRead) ? fBytesToRead : cnt;
	memcpy(fWritePtr, buffer, consume);
	fWritePtr		+= consume;
	fBytesRead		+= consume;
	fTotalBytesRead	+= consume;
	fBytesToRead	-= consume;

	//printf("write callback consuming %d bytes\n", consume);

	// If bytes remain, rebuffer as many as possible into our holding buffer
	buffer			+= consume;
	totalConsumed	+= consume;
	cnt				-= consume;
	if (cnt > 0)
	{
		XMLSize_t bufAvail = sizeof(fBuffer) - (fBufferHeadPtr - fBuffer);
		consume = (cnt > bufAvail) ? bufAvail : cnt;
		memcpy(fBufferHeadPtr, buffer, consume);
		fBufferHeadPtr	+= consume;
		buffer			+= consume;
		totalConsumed	+= consume;
		//printf("write callback rebuffering %d bytes\n", consume);
	}

	// Return the total amount we've consumed. If we don't consume all the bytes
	// then an error will be generated. Since our buffer size is equal to the
	// maximum size that curl will write, this should never happen unless there
	// is a logic error somewhere here.
	return totalConsumed;
}